

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O1

void __thiscall soplex::SPxParMultPR<double>::setType(SPxParMultPR<double> *this,Type tp)

{
  if (tp == ENTER) {
    this->used = 0;
  }
  SPxSolverBase<double>::setPricing((this->super_SPxPricer<double>).thesolver,(uint)(tp == ENTER));
  VectorBase<double>::reDim(&((this->super_SPxPricer<double>).thesolver)->weights,0,true);
  VectorBase<double>::reDim(&((this->super_SPxPricer<double>).thesolver)->coWeights,0,true);
  ((this->super_SPxPricer<double>).thesolver)->weightsAreSetup = false;
  this->last = 0;
  this->min = this->partialSize / 2;
  return;
}

Assistant:

void SPxParMultPR<R>::setType(typename SPxSolverBase<R>::Type tp)
{
   if(tp == SPxSolverBase<R>::ENTER)
   {
      used = 0;
      this->thesolver->setPricing(SPxSolverBase<R>::PARTIAL);
   }
   else
   {
      this->thesolver->setPricing(SPxSolverBase<R>::FULL);
   }

   this->thesolver->weights.reDim(0);
   this->thesolver->coWeights.reDim(0);
   this->thesolver->weightsAreSetup = false;

   last = 0;
   min = partialSize / 2;
}